

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O2

void __thiscall OpenMD::ContactAngle2::doFrame(ContactAngle2 *this,int param_1)

{
  SelectionManager *this_00;
  RealType RVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  int iVar7;
  RealType RVar8;
  RealType RVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  pointer pVVar13;
  pointer pVVar14;
  int iVar15;
  pointer pdVar16;
  StuntDouble *this_01;
  undefined4 extraout_EDX;
  undefined4 uVar17;
  pointer pvVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double local_2a8;
  double dStack_2a0;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  histo;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> points;
  DynamicRectMatrix<double> mat;
  DynamicRectMatrix<double> evects;
  Vector<double,_2U> diff;
  Vector<double,_2U> average;
  DynamicVector<double,_std::allocator<double>_> evector;
  Vector<double,_2U> current;
  Vector3d pos;
  DynamicVector<double,_std::allocator<double>_> evals;
  Vector<double,_2U> local_168;
  RealType coeff [3];
  Vector<double,_3U> local_138;
  Eigenvalue<double> eigensystem;
  OpenMD local_98 [16];
  Vector<double,_2U> derLenAverage;
  Mat3x3d hmat;
  
  Snapshot::getHmat(&hmat,((this->super_SequentialAnalyzer).info_)->sman_->currentSnapshot_);
  if (hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] <=
      hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) {
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  uVar25 = this->nRBins_;
  uVar19 = this->nZBins_;
  histo.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  histo.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  histo.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&histo,this->nRBins_);
  auVar30._0_8_ =
       ((double)(uVar25 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar25 & 0xffffffff | 0x4330000000000000);
  auVar30._8_8_ =
       ((double)(uVar19 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar19 & 0xffffffff | 0x4330000000000000);
  auVar28._8_8_ = hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  auVar28._0_8_ = hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  auVar28 = divpd(auVar28,auVar30);
  uVar20 = 0;
  while( true ) {
    uVar25 = (ulong)uVar20;
    if ((ulong)(((long)histo.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)histo.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar25) break;
    std::vector<double,_std::allocator<double>_>::resize
              (histo.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar25,this->nZBins_);
    pdVar2 = histo.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar16 = histo.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar25].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; pdVar16 != pdVar2; pdVar16 = pdVar16 + 1) {
      *pdVar16 = 0.0;
    }
    uVar20 = uVar20 + 1;
  }
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ != false) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)&eigensystem,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet
              (&(this->super_SequentialAnalyzer).seleMan1_,(SelectionSet *)&eigensystem);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&eigensystem);
  }
  RVar1 = this->solidZ_;
  RVar8 = this->centroidX_;
  RVar9 = this->centroidY_;
  Vector<double,_3U>::Vector(&local_138);
  local_138.data_[0] = RVar8;
  local_138.data_[1] = RVar9;
  local_138.data_[2] = RVar1;
  Vector<double,_3U>::Vector(&pos.super_Vector<double,_3U>);
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  this_01 = SelectionManager::beginSelected(this_00,&i);
  while (this_01 != (StuntDouble *)0x0) {
    StuntDouble::getPos((Vector3d *)&points,this_01);
    operator-((Vector<double,_3U> *)&eigensystem,(Vector<double,_3U> *)&points,&local_138);
    Vector3<double>::operator=(&pos,(Vector<double,_3U> *)&eigensystem);
    auVar29._0_8_ =
         SQRT(pos.super_Vector<double,_3U>.data_[1] * pos.super_Vector<double,_3U>.data_[1] +
              pos.super_Vector<double,_3U>.data_[0] * pos.super_Vector<double,_3U>.data_[0]);
    auVar29._8_8_ =
         pos.super_Vector<double,_3U>.data_[2] +
         hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] * 0.5;
    auVar30 = divpd(auVar29,auVar28);
    iVar26 = (int)auVar30._0_8_;
    uVar20 = (uint)auVar30._8_8_;
    iVar15 = (int)this->nRBins_;
    iVar7 = (int)this->nZBins_;
    auVar32._0_4_ = -(uint)(iVar26 < iVar15);
    auVar32._4_4_ = -(uint)(iVar26 < iVar15);
    auVar32._8_4_ = -(uint)((int)uVar20 < iVar7);
    auVar32._12_4_ = -(uint)((int)uVar20 < iVar7);
    uVar17 = movmskpd(extraout_EDX,auVar32);
    if ((byte)(-1 < (int)uVar20 & (byte)uVar17 & (byte)uVar17 >> 1) == 1) {
      pdVar16 = histo.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar26].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar16[uVar20] = this_01->mass_ + pdVar16[uVar20];
    }
    this_01 = SelectionManager::nextSelected(this_00,&i);
  }
  dStack_2a0 = auVar28._8_8_;
  dVar31 = 0.0;
  for (uVar20 = 0; uVar25 = (ulong)uVar20, local_2a8 = auVar28._0_8_,
      uVar25 < (ulong)(((long)histo.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)histo.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar20 = uVar20 + 1
      ) {
    dVar33 = local_2a8 * dVar31;
    pdVar16 = histo.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar25].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar2 = histo.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (uVar22 = 0; uVar25 = (ulong)uVar22, uVar25 < (ulong)((long)pdVar2 - (long)pdVar16 >> 3);
        uVar22 = uVar22 + 1) {
      pdVar16[uVar25] =
           pdVar16[uVar25] *
           (1.66053886 /
           (((local_2a8 + dVar33) * (local_2a8 + dVar33) - dVar33 * dVar33) *
           dStack_2a0 * 3.141592653589793));
    }
    dVar31 = dVar31 + 1.0;
  }
  points.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  points.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  points.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar20 = 0;
  while( true ) {
    pVVar14 = points.
              super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pVVar13 = points.
              super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = (ulong)uVar20;
    if (this->nZBins_ <= uVar25) break;
    uVar19 = 0;
    bVar10 = false;
    bVar12 = 0;
    pvVar18 = histo.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar21 = 0; this->nRBins_ != uVar21; uVar21 = uVar21 + 1) {
      dVar31 = (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar25];
      bVar12 = this->threshDens_ <= dVar31 | bVar12;
      bVar11 = (bool)(dVar31 <= this->threshDens_ & bVar12);
      if (bVar11) {
        uVar19 = uVar21 & 0xffffffff;
      }
      bVar10 = (bool)(bVar10 | bVar11);
      bVar12 = bVar11 ^ bVar12;
      pvVar18 = pvVar18 + 1;
    }
    if (bVar10) {
      eigensystem.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(((double)uVar25 + 0.5) * dStack_2a0 +
                    ((local_138.data_[2] - this->solidZ_) -
                    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]
                    * 0.5));
      eigensystem._0_8_ = ((double)(int)uVar19 + 0.5) * local_2a8;
      if (this->bufferLength_ <=
          (double)eigensystem.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start &&
          (double)eigensystem.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != this->bufferLength_) {
        std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
        push_back(&points,(value_type *)&eigensystem);
      }
    }
    uVar20 = uVar20 + 1;
  }
  Vector<double,_2U>::Vector
            (&average,points.
                      super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  uVar25 = (ulong)((long)pVVar14 - (long)pVVar13) >> 4;
  iVar15 = (int)uVar25;
  lVar24 = 0x10;
  for (lVar23 = 1; lVar23 < iVar15; lVar23 = lVar23 + 1) {
    Vector<double,_2U>::add
              (&average,(Vector<double,_2U> *)
                        ((long)(points.
                                super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->data_ + lVar24));
    lVar24 = lVar24 + 0x10;
  }
  dVar31 = 1.0 / (double)iVar15;
  Vector<double,_2U>::mul(&average,dVar31);
  DynamicRectMatrix<double>::DynamicRectMatrix(&mat,4,4);
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    pdVar3 = mat.data_[lVar23];
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pdVar3[lVar24] = 0.0;
    }
  }
  uVar19 = 0;
  uVar25 = uVar25 & 0xffffffff;
  if (iVar15 < 1) {
    uVar25 = uVar19;
  }
  for (; uVar25 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
    pdVar4 = *mat.data_;
    pdVar3 = (double *)
             ((long)(points.
                     super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->data_ + uVar19);
    dVar33 = *pdVar3;
    dVar27 = pdVar3[1];
    auVar6._8_4_ = SUB84(pdVar4[2] + dVar27,0);
    auVar6._0_8_ = pdVar4[1] + dVar33;
    auVar6._12_4_ = (int)((ulong)(pdVar4[2] + dVar27) >> 0x20);
    *(undefined1 (*) [16])(pdVar4 + 1) = auVar6;
    pdVar3 = mat.data_[1];
    pdVar5 = mat.data_[2];
    dVar34 = dVar33 * dVar33 + dVar27 * dVar27;
    pdVar4[3] = dVar34 + pdVar4[3];
    pdVar3[1] = pdVar3[1] + dVar33 * dVar33;
    pdVar3[2] = pdVar3[2] + dVar33 * dVar27;
    pdVar3[3] = dVar33 * dVar34 + pdVar3[3];
    pdVar5[2] = dVar27 * dVar27 + pdVar5[2];
    pdVar5[3] = dVar27 * dVar34 + pdVar5[3];
    mat.data_[3][3] = dVar34 * dVar34 + mat.data_[3][3];
  }
  **mat.data_ = (double)iVar15;
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
      mat.data_[lVar23][lVar24] = mat.data_[lVar24][lVar23];
    }
  }
  for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
    pdVar3 = mat.data_[lVar23];
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pdVar3[lVar24] = pdVar3[lVar24] * dVar31;
    }
  }
  JAMA::Eigenvalue<double>::Eigenvalue(&eigensystem,&mat);
  DynamicRectMatrix<double>::DynamicRectMatrix(&evects,4,4);
  std::vector<double,_std::allocator<double>_>::vector(&evals.data_,4,(allocator_type *)&evector);
  JAMA::Eigenvalue<double>::getRealEigenvalues(&eigensystem,&evals);
  JAMA::Eigenvalue<double>::getV(&eigensystem,&evects);
  DynamicRectMatrix<double>::getColumn(&evector,&evects,0);
  dVar33 = evector.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
    coeff[lVar23] =
         evector.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar23] * (1.0 / dVar33);
  }
  local_168.data_[0] = coeff[1] * -0.5;
  local_168.data_[1] = coeff[2] * -0.5;
  dVar33 = SQRT(ABS((local_168.data_[0] * local_168.data_[0] +
                    local_168.data_[1] * local_168.data_[1]) - coeff[0]));
  for (iVar15 = 0; iVar15 != 100; iVar15 = iVar15 + 1) {
    Vector<double,_2U>::Vector(&current,&local_168);
    diff.data_[0] = 0.0;
    Vector<double,_2U>::Vector(&derLenAverage,(double *)&diff);
    dVar33 = 0.0;
    for (uVar19 = 0; uVar25 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
      operator-((OpenMD *)&diff,
                (Vector<double,_2U> *)
                ((long)(points.
                        super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->data_ + uVar19),&local_168);
      dVar27 = Vector<double,_2U>::length(&diff);
      if (1e-06 < dVar27) {
        operator*(local_98,1.0 / dVar27,&diff);
        dVar33 = dVar33 + dVar27;
        Vector<double,_2U>::sub(&derLenAverage,(Vector<double,_2U> *)local_98);
      }
    }
    dVar33 = dVar33 * dVar31;
    Vector<double,_2U>::mul(&derLenAverage,dVar31);
    operator*(local_98,dVar33,&derLenAverage);
    operator+((OpenMD *)&diff,&average,(Vector<double,_2U> *)local_98);
    Vector<double,_2U>::operator=(&local_168,&diff);
    operator-((OpenMD *)&diff,&local_168,&current);
    if ((ABS(diff.data_[0]) <= 1e-06) && (ABS(diff.data_[1]) <= 1e-06)) break;
  }
  if (ABS(local_168.data_[1]) <= dVar33) {
    dVar31 = asin(local_168.data_[1] / dVar33);
    current.data_[0] = dVar31 * 57.29577951308232 + 90.0;
  }
  else {
    current.data_[0] = 180.0;
  }
  std::vector<double,_std::allocator<double>_>::push_back
            (&(this->super_SequentialAnalyzer).values_,current.data_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&evector);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&evals);
  DynamicRectMatrix<double>::deallocate(&evects);
  JAMA::Eigenvalue<double>::~Eigenvalue(&eigensystem);
  DynamicRectMatrix<double>::deallocate(&mat);
  std::_Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
  ~_Vector_base(&points.
                 super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
               );
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&histo);
  return;
}

Assistant:

void ContactAngle2::doFrame(int) {
    StuntDouble* sd;
    int i;

    // set up the bins for density analysis

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    RealType len = std::min(hmat(0, 0), hmat(1, 1));
    RealType zLen = hmat(2, 2);

    RealType dr = len / (RealType)nRBins_;
    RealType dz = zLen / (RealType)nZBins_;

    std::vector<std::vector<RealType>> histo;
    histo.resize(nRBins_);
    for (unsigned int i = 0; i < histo.size(); ++i) {
      histo[i].resize(nZBins_);
      std::fill(histo[i].begin(), histo[i].end(), 0.0);
    }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    Vector3d com(centroidX_, centroidY_, solidZ_);

    // now that we have the centroid, we can make cylindrical density maps
    Vector3d pos;
    RealType r;
    RealType z;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      pos = sd->getPos() - com;

      // r goes from zero upwards
      r = sqrt(pow(pos.x(), 2) + pow(pos.y(), 2));
      // z is possibly symmetric around 0
      z = pos.z();

      int whichRBin = int(r / dr);
      int whichZBin = int((zLen / 2.0 + z) / dz);

      if ((whichRBin < int(nRBins_)) && (whichZBin >= 0) &&
          (whichZBin < int(nZBins_))) {
        histo[whichRBin][whichZBin] += sd->getMass();
      }
    }

    for (unsigned int i = 0; i < histo.size(); ++i) {
      RealType rL       = i * dr;
      RealType rU       = rL + dr;
      RealType volSlice = Constants::PI * dz * ((rU * rU) - (rL * rL));

      for (unsigned int j = 0; j < histo[i].size(); ++j) {
        histo[i][j] *= Constants::densityConvert / volSlice;
      }
    }

    std::vector<Vector<RealType, 2>> points;
    points.clear();

    for (unsigned int j = 0; j < nZBins_; ++j) {
      // The z coordinates were measured relative to the selection
      // center of mass.  However, we're interested in the elevation
      // above the solid surface.  Also, the binning was done around
      // zero with enough bins to cover the zLength of the box:

      RealType thez    = com.z() - solidZ_ - zLen / 2.0 + dz * (j + 0.5);
      bool aboveThresh = false;
      bool foundThresh = false;
      int rloc         = 0;

      for (std::size_t i = 0; i < nRBins_; ++i) {
        if (histo[i][j] >= threshDens_) aboveThresh = true;

        if (aboveThresh && (histo[i][j] <= threshDens_)) {
          rloc        = i;
          foundThresh = true;
          aboveThresh = false;
        }
      }
      if (foundThresh) {
        Vector<RealType, 2> point;
        point[0] = dr * (rloc + 0.5);
        point[1] = thez;

        if (thez > bufferLength_) { points.push_back(point); }
      }
    }

    int numPoints = points.size();

    // Compute the average of the data points.
    Vector<RealType, 2> average = points[0];
    int i0;
    for (i0 = 1; i0 < numPoints; ++i0) {
      average += points[i0];
    }
    RealType invNumPoints = ((RealType)1) / (RealType)numPoints;
    average *= invNumPoints;

    DynamicRectMatrix<RealType> mat(4, 4);
    int row, col;
    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) = 0.0;
      }
    }
    for (int i = 0; i < numPoints; ++i) {
      RealType x   = points[i][0];
      RealType y   = points[i][1];
      RealType x2  = x * x;
      RealType y2  = y * y;
      RealType xy  = x * y;
      RealType r2  = x2 + y2;
      RealType xr2 = x * r2;
      RealType yr2 = y * r2;
      RealType r4  = r2 * r2;

      mat(0, 1) += x;
      mat(0, 2) += y;
      mat(0, 3) += r2;
      mat(1, 1) += x2;
      mat(1, 2) += xy;
      mat(1, 3) += xr2;
      mat(2, 2) += y2;
      mat(2, 3) += yr2;
      mat(3, 3) += r4;
    }
    mat(0, 0) = (RealType)numPoints;

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < row; ++col) {
        mat(row, col) = mat(col, row);
      }
    }

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) *= invNumPoints;
      }
    }

    JAMA::Eigenvalue<RealType> eigensystem(mat);
    DynamicRectMatrix<RealType> evects(4, 4);
    DynamicVector<RealType> evals(4);

    eigensystem.getRealEigenvalues(evals);
    eigensystem.getV(evects);

    DynamicVector<RealType> evector = evects.getColumn(0);
    RealType inv = ((RealType)1) / evector[3];  // beware zero divide
    RealType coeff[3];
    for (row = 0; row < 3; ++row) {
      coeff[row] = inv * evector[row];
    }

    Vector<RealType, 2> center;

    center[0] = -((RealType)0.5) * coeff[1];
    center[1] = -((RealType)0.5) * coeff[2];
    RealType radius =
        sqrt(fabs(center[0] * center[0] + center[1] * center[1] - coeff[0]));

    int i1;
    for (i1 = 0; i1 < 100; ++i1) {
      // Update the iterates.
      Vector<RealType, 2> current = center;

      // Compute average L, dL/da, dL/db.
      RealType lenAverage               = (RealType)0;
      Vector<RealType, 2> derLenAverage = Vector<RealType, 2>(0.0);
      for (i0 = 0; i0 < numPoints; ++i0) {
        Vector<RealType, 2> diff = points[i0] - center;
        RealType length          = diff.length();
        if (length > 1e-6) {
          lenAverage += length;
          RealType invLength = ((RealType)1) / length;
          derLenAverage -= invLength * diff;
        }
      }
      lenAverage *= invNumPoints;
      derLenAverage *= invNumPoints;

      center = average + lenAverage * derLenAverage;
      radius = lenAverage;

      Vector<RealType, 2> diff = center - current;
      if (fabs(diff[0]) <= 1e-6 && fabs(diff[1]) <= 1e-6) { break; }
    }

    RealType zCen  = center[1];
    RealType rDrop = radius;
    RealType ca;

    if (fabs(zCen) > rDrop) {
      ca = 180.0;
    } else {
      ca = 90.0 + asin(zCen / rDrop) * (180.0 / Constants::PI);
    }

    values_.push_back(ca);
  }